

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.c
# Opt level: O1

int m_encode_zero(aec_stream *strm)

{
  internal_state *piVar1;
  uint8_t *puVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  long lVar8;
  code *pcVar9;
  int iVar10;
  
  piVar1 = strm->state;
  iVar4 = piVar1->id_len;
  iVar5 = piVar1->bits;
  if (iVar4 < iVar5) {
    piVar1->bits = iVar5 - (iVar4 + 1);
  }
  else {
    iVar10 = (iVar4 + 1) - iVar5;
    piVar1->cds = piVar1->cds + 1;
    if (8 < iVar10) {
      iVar4 = (iVar4 - iVar5) + 9;
      do {
        iVar10 = iVar4;
        puVar2 = piVar1->cds;
        piVar1->cds = puVar2 + 1;
        *puVar2 = '\0';
        iVar4 = iVar10 + -8;
      } while (0x10 < iVar4);
      iVar10 = iVar10 + -0x10;
    }
    piVar1->bits = 8 - iVar10;
    *piVar1->cds = '\0';
  }
  if (piVar1->zero_ref != 0) {
    iVar4 = piVar1->bits;
    uVar7 = piVar1->zero_ref_sample;
    uVar6 = strm->bits_per_sample;
    if (iVar4 < (int)uVar6) {
      iVar4 = uVar6 - iVar4;
      puVar2 = piVar1->cds;
      piVar1->cds = puVar2 + 1;
      *puVar2 = *puVar2 + (char)(uVar7 >> ((byte)iVar4 & 0x3f));
      iVar5 = iVar4;
      if (8 < iVar4) {
        do {
          iVar4 = iVar5 + -8;
          puVar2 = piVar1->cds;
          piVar1->cds = puVar2 + 1;
          *puVar2 = (uint8_t)(uVar7 >> ((byte)iVar4 & 0x1f));
          bVar3 = 0x10 < iVar5;
          iVar5 = iVar4;
        } while (bVar3);
      }
      piVar1->bits = 8 - iVar4;
      *piVar1->cds = (uint8_t)(uVar7 << ((byte)(8 - iVar4) & 0x1f));
    }
    else {
      piVar1->bits = iVar4 - uVar6;
      *piVar1->cds = *piVar1->cds + (char)(uVar7 << ((byte)(iVar4 - uVar6) & 0x1f));
    }
  }
  uVar7 = piVar1->zero_blocks;
  if (uVar7 == 0xffffffff) {
    iVar4 = piVar1->bits;
    uVar7 = 0xfffffffb;
    if (iVar4 < 5) {
      uVar7 = 4;
      do {
        uVar7 = uVar7 - iVar4;
        puVar2 = piVar1->cds;
        piVar1->cds = puVar2 + 1;
        puVar2[1] = '\0';
        piVar1->bits = 8;
        iVar4 = 8;
      } while (7 < (int)uVar7);
      goto LAB_0019c0b7;
    }
  }
  else {
    if ((int)uVar7 < 5) {
      uVar6 = uVar7 - 1;
      iVar4 = piVar1->bits;
      if (iVar4 < (int)uVar7) {
        do {
          uVar6 = uVar6 - iVar4;
          puVar2 = piVar1->cds;
          piVar1->cds = puVar2 + 1;
          puVar2[1] = '\0';
          piVar1->bits = 8;
          iVar4 = 8;
        } while (7 < (int)uVar6);
      }
      iVar4 = ~uVar6 + iVar4;
      goto LAB_0019c0f6;
    }
    iVar4 = piVar1->bits;
    if (iVar4 <= (int)uVar7) {
      do {
        uVar7 = uVar7 - iVar4;
        puVar2 = piVar1->cds;
        piVar1->cds = puVar2 + 1;
        puVar2[1] = '\0';
        piVar1->bits = 8;
        iVar4 = 8;
      } while (7 < (int)uVar7);
    }
LAB_0019c0b7:
    uVar7 = ~uVar7;
  }
  iVar4 = uVar7 + iVar4;
LAB_0019c0f6:
  piVar1->bits = iVar4;
  *piVar1->cds = *piVar1->cds + (char)(1 << ((byte)iVar4 & 0x1f));
  piVar1->zero_blocks = 0;
  piVar1 = strm->state;
  if (piVar1->direct_out == 0) {
    piVar1->i = 0;
    pcVar9 = m_flush_block_resumable;
  }
  else {
    lVar8 = (long)(*(int *)&piVar1->cds - (int)strm->next_out);
    strm->next_out = strm->next_out + lVar8;
    strm->avail_out = strm->avail_out - lVar8;
    pcVar9 = m_get_block;
  }
  piVar1->mode = pcVar9;
  return 1;
}

Assistant:

static int m_encode_zero(struct aec_stream *strm)
{
    struct internal_state *state = strm->state;

    emit(state, 0, state->id_len + 1);

    if (state->zero_ref)
        emit(state, state->zero_ref_sample, strm->bits_per_sample);

    if (state->zero_blocks == ROS)
        emitfs(state, 4);
    else if (state->zero_blocks >= 5)
        emitfs(state, state->zero_blocks);
    else
        emitfs(state, state->zero_blocks - 1);

    state->zero_blocks = 0;
    return m_flush_block(strm);
}